

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectWrongNumTermsError(Parse *pParse,Select *p)

{
  char *pcVar1;
  byte *in_RSI;
  Parse *in_RDI;
  
  if ((*(uint *)(in_RSI + 4) & 0x200) == 0) {
    pcVar1 = sqlite3SelectOpName((uint)*in_RSI);
    sqlite3ErrorMsg(in_RDI,
                    "SELECTs to the left and right of %s do not have the same number of result columns"
                    ,pcVar1);
  }
  else {
    sqlite3ErrorMsg(in_RDI,"all VALUES must have the same number of terms");
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectWrongNumTermsError(Parse *pParse, Select *p){
  if( p->selFlags & SF_Values ){
    sqlite3ErrorMsg(pParse, "all VALUES must have the same number of terms");
  }else{
    sqlite3ErrorMsg(pParse, "SELECTs to the left and right of %s"
      " do not have the same number of result columns",
      sqlite3SelectOpName(p->op));
  }
}